

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_negation_array2(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  roaring_bitmap_t *prVar2;
  uint32_t val;
  
  val = 0;
  r = roaring_bitmap_create_with_capacity(0);
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xbad);
  do {
    roaring_bitmap_add(r,val);
    roaring_bitmap_add(r,val + 0x50000);
    val = val + 2;
  } while (val != 200);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_int_equal(uVar1,200,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbb4);
  prVar2 = roaring_bitmap_flip(r,0,100000);
  _assert_true((unsigned_long)prVar2,"notted_r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,3000);
  uVar1 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(100000,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbbb);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_flip(r,0,1000000);
  _assert_true((unsigned_long)prVar2,"notted_r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xbc0);
  uVar1 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0xf4178,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbc1);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_flip(r,100000,200000);
  _assert_true((unsigned_long)prVar2,"notted_r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xbc6);
  uVar1 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0x18768,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbc7);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_flip(r,1,0x60000);
  _assert_true((unsigned_long)prVar2,"notted_r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xbcc);
  uVar1 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0x5ff39,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbce);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_flip(r,1,0x50000);
  _assert_true((unsigned_long)prVar2,"notted_r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xbd3);
  uVar1 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0x50001,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xbd5);
  roaring_bitmap_free(prVar2);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_negation_array2) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    for (uint32_t i = 0; i < 100; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r1, 5 * 65536 + 2 * i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1), 200);

    // get the first batch of ones but not the second
    roaring_bitmap_t *notted_r1 = roaring_bitmap_flip(r1, 0U, 100000U);
    assert_non_null(notted_r1);

    // lose 100 for key 0, but gain 100 for key 5
    assert_int_equal(100000, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip all ones and beyond
    notted_r1 = roaring_bitmap_flip(r1, 0U, 1000000U);
    assert_non_null(notted_r1);
    assert_int_equal(1000000 - 200, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // Flip some bits in the middle
    notted_r1 = roaring_bitmap_flip(r1, 100000U, 200000U);
    assert_non_null(notted_r1);
    assert_int_equal(100000 + 200, roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip almost all of the bits, end at an even boundary
    notted_r1 = roaring_bitmap_flip(r1, 1U, 65536 * 6);
    assert_non_null(notted_r1);
    assert_int_equal(65536 * 6 - 200 + 1,
                     roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    // flip first bunch of the bits, end at an even boundary
    notted_r1 = roaring_bitmap_flip(r1, 1U, 65536 * 5);
    assert_non_null(notted_r1);
    assert_int_equal(65536 * 5 - 100 + 1 + 100,
                     roaring_bitmap_get_cardinality(notted_r1));
    roaring_bitmap_free(notted_r1);

    roaring_bitmap_free(r1);
}